

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate(CoreType type,string_view coreName,int argc,char **argv)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  shared_ptr<helics::Core> sVar4;
  shared_ptr<helics::Core> *core;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  shared_ptr<helics::Core> *this;
  CoreType in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  shared_ptr<helics::Core> local_58 [2];
  CoreType type_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar5;
  
  type_00 = (CoreType)((ulong)in_RCX >> 0x20);
  uVar5 = 0;
  name._M_str = in_stack_ffffffffffffff98;
  name._M_len = in_stack_ffffffffffffff90;
  findCore(name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  _Var3._M_pi = extraout_RDX;
  if (!bVar1) {
    name_00._M_str = in_RDX;
    name_00._M_len = in_stack_ffffffffffffff90;
    makeCore(in_stack_ffffffffffffff8c,name_00);
    this = local_58;
    std::shared_ptr<helics::Core>::operator=
              (this,(shared_ptr<helics::Core> *)
                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x455c57);
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x455c61);
    (*peVar2->_vptr_Core[3])(peVar2,(ulong)in_R8D,in_R9);
    uVar5 = registerCore((shared_ptr<helics::Core> *)CONCAT17(uVar5,in_stack_ffffffffffffffd0),
                         type_00);
    _Var3._M_pi = extraout_RDX_00;
    if (!(bool)uVar5) {
      name_01._M_str = in_RDX;
      name_01._M_len = in_stack_ffffffffffffff90;
      findCore(name_01);
      std::shared_ptr<helics::Core>::operator=
                (this,(shared_ptr<helics::Core> *)CONCAT17(uVar5,in_stack_ffffffffffffff48));
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x455cdb);
      std::__shared_ptr::operator_cast_to_bool(in_RDI);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> FindOrCreate(CoreType type, std::string_view coreName, int argc, char* argv[])
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);

    core->configureFromArgs(argc, argv);
    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}